

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_elements_output_init_alloc
              (uchar *script,size_t script_len,uchar *asset,size_t asset_len,uchar *value,
              size_t value_len,uchar *nonce,size_t nonce_len,uchar *surjectionproof,
              size_t surjectionproof_len,uchar *rangeproof,size_t rangeproof_len,
              wally_tx_output **output)

{
  wally_tx_output *pwVar1;
  int ret;
  wally_tx_output *result;
  size_t value_len_local;
  uchar *value_local;
  size_t asset_len_local;
  uchar *asset_local;
  size_t script_len_local;
  uchar *script_local;
  
  if (output == (wally_tx_output **)0x0) {
    script_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx_output *)0x0;
    pwVar1 = (wally_tx_output *)wally_calloc(0x70);
    *output = pwVar1;
    if (*output == (wally_tx_output *)0x0) {
      script_local._4_4_ = -3;
    }
    else {
      pwVar1 = *output;
      script_local._4_4_ =
           tx_elements_output_init
                     (0xffffffffffffffff,script,script_len,asset,asset_len,value,value_len,nonce,
                      nonce_len,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len,pwVar1
                      ,true);
      if (script_local._4_4_ != 0) {
        clear_and_free(pwVar1,0x70);
        *output = (wally_tx_output *)0x0;
      }
    }
  }
  return script_local._4_4_;
}

Assistant:

int wally_tx_elements_output_init_alloc(
    const unsigned char *script,
    size_t script_len,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    struct wally_tx_output **output)
{
    struct wally_tx_output *result;
    int ret;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_output);

    ret = tx_elements_output_init(-1, script, script_len,
                                  asset, asset_len,
                                  value, value_len,
                                  nonce, nonce_len,
                                  surjectionproof,
                                  surjectionproof_len,
                                  rangeproof, rangeproof_len,
                                  result, true);
    if (ret != WALLY_OK) {
        clear_and_free(result, sizeof(*result));
        *output = NULL;
    }
    return ret;
}